

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImVec2 ImBezierCalc(ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,float t)

{
  ImVec2 IVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar4 = 1.0 - t;
  fVar3 = fVar4 * fVar4 * fVar4;
  fVar5 = fVar4 * fVar4 * 3.0 * t;
  fVar2 = fVar4 * 3.0 * t * t;
  fVar4 = t * t * t;
  IVar1.y = fVar4 * (*p4).y + fVar2 * (*p3).y + fVar3 * (*p1).y + fVar5 * (*p2).y;
  IVar1.x = fVar4 * (*p4).x + fVar2 * (*p3).x + fVar3 * (*p1).x + fVar5 * (*p2).x;
  return IVar1;
}

Assistant:

ImVec2 ImBezierCalc(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, float t)
{
    float u = 1.0f - t;
    float w1 = u*u*u;
    float w2 = 3*u*u*t;
    float w3 = 3*u*t*t;
    float w4 = t*t*t;
    return ImVec2(w1*p1.x + w2*p2.x + w3*p3.x + w4*p4.x, w1*p1.y + w2*p2.y + w3*p3.y + w4*p4.y);
}